

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O3

char gear_to_label(player *p,object *obj)

{
  ushort uVar1;
  wchar_t wVar2;
  ulong uVar3;
  object **ppoVar4;
  
  uVar1 = (p->body).count;
  if (uVar1 == 0) {
    uVar3 = 0;
LAB_0017dc5a:
    if ((int)uVar3 < (int)(uint)uVar1) {
      wVar2 = equipped_item_slot(p->body,obj);
      return "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[wVar2];
    }
  }
  else {
    ppoVar4 = &((p->body).slots)->obj;
    uVar3 = 0;
    do {
      if (*ppoVar4 == obj) goto LAB_0017dc5a;
      uVar3 = uVar3 + 1;
      ppoVar4 = ppoVar4 + 4;
    } while ((uint)uVar1 != uVar3);
  }
  if ((ulong)z_info->quiver_size != 0) {
    uVar3 = 0;
    do {
      if (p->upkeep->quiver[uVar3] == obj) {
        return (char)uVar3 + '0';
      }
      uVar3 = uVar3 + 1;
    } while (z_info->quiver_size != uVar3);
  }
  if ((ulong)z_info->pack_size != 0) {
    uVar3 = 0;
    do {
      if (p->upkeep->inven[uVar3] == obj) {
        return "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar3];
      }
      uVar3 = uVar3 + 1;
    } while (z_info->pack_size != uVar3);
  }
  return '\0';
}

Assistant:

char gear_to_label(struct player *p, struct object *obj)
{
	/* Skip rogue-like cardinal direction movement keys. */
	const char labels[] =
		 "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ";
	int i;

	/* Equipment is easy */
	if (object_is_equipped(p->body, obj)) {
		return labels[equipped_item_slot(p->body, obj)];
	}

	/* Check the quiver */
	for (i = 0; i < z_info->quiver_size; i++) {
		if (p->upkeep->quiver[i] == obj) {
			return I2D(i);
		}
	}

	/* Check the inventory */
	for (i = 0; i < z_info->pack_size; i++) {
		if (p->upkeep->inven[i] == obj) {
			return labels[i];
		}
	}

	return '\0';
}